

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_perform_authentication(connectdata *conn)

{
  smtpstate local_48;
  smtpstate local_44;
  smtpstate state2;
  smtpstate state1;
  size_t len;
  char *initresp;
  char *mech;
  smtp_conn *smtpc;
  connectdata *pcStack_18;
  CURLcode result;
  connectdata *conn_local;
  
  smtpc._4_4_ = CURLE_OK;
  mech = (char *)&conn->proto;
  initresp = (char *)0x0;
  len = 0;
  _state2 = 0;
  local_44 = SMTP_STOP;
  local_48 = SMTP_STOP;
  pcStack_18 = conn;
  if ((((conn->bits).user_passwd & 1U) == 0) || (((conn->proto).imapc.resptag[2] & 1U) == 0)) {
    state(conn,SMTP_STOP);
    conn_local._4_4_ = smtpc._4_4_;
  }
  else {
    smtpc._4_4_ = smtp_calc_sasl_details
                            (conn,&initresp,(char **)&len,(size_t *)&state2,&local_44,&local_48);
    if (smtpc._4_4_ == CURLE_OK) {
      if (initresp == (char *)0x0) {
        Curl_infof(pcStack_18->data,"No known authentication mechanisms supported!\n");
        smtpc._4_4_ = CURLE_LOGIN_DENIED;
      }
      else {
        smtpc._4_4_ = smtp_perform_auth(pcStack_18,initresp,(char *)len,_state2,local_44,local_48);
        if (len != 0) {
          (*Curl_cfree)((void *)len);
        }
      }
    }
    conn_local._4_4_ = smtpc._4_4_;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smtp_perform_authentication(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  const char *mech = NULL;
  char *initresp = NULL;
  size_t len = 0;
  smtpstate state1 = SMTP_STOP;
  smtpstate state2 = SMTP_STOP;

  /* Check we have a username and password to authenticate with, and the
     server supports authentiation, and end the connect phase if not */
  if(!conn->bits.user_passwd || !smtpc->auth_supported) {
    state(conn, SMTP_STOP);

    return result;
  }

  /* Calculate the SASL login details */
  result = smtp_calc_sasl_details(conn, &mech, &initresp, &len, &state1,
                                  &state2);

  if(!result) {
    if(mech) {
      /* Perform SASL based authentication */
      result = smtp_perform_auth(conn, mech, initresp, len, state1, state2);

      Curl_safefree(initresp);
    }
    else {
      /* Other mechanisms not supported */
      infof(conn->data, "No known authentication mechanisms supported!\n");
      result = CURLE_LOGIN_DENIED;
    }
  }

  return result;
}